

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandCDUP(FtpSession *this,string *param_1)

{
  element_type *peVar1;
  bool bVar2;
  string *this_00;
  FtpMessage cwd_reply;
  allocator local_51;
  undefined1 local_50 [40];
  string local_28;
  
  peVar1 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    ::std::__cxx11::string::string((string *)local_50,"Not logged in",(allocator *)&local_28);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_50);
  }
  else if ((peVar1->permissions_ & DirList) == None) {
    ::std::__cxx11::string::string((string *)local_50,"Permission denied",(allocator *)&local_28);
    sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_50);
  }
  else {
    bVar2 = ::std::operator!=(&this->ftp_working_directory_,"/");
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&local_28,"..",&local_51);
      executeCWD((FtpMessage *)local_50,this,&local_28);
      ::std::__cxx11::string::~string((string *)&local_28);
      if (local_50._0_4_ == FILE_ACTION_COMPLETED) {
        ::std::__cxx11::string::string((string *)&local_28,(string *)(local_50 + 8));
        sendFtpMessage(this,COMMAND_OK,&local_28);
        ::std::__cxx11::string::~string((string *)&local_28);
      }
      else {
        sendFtpMessage(this,(FtpMessage *)local_50);
      }
      this_00 = (string *)(local_50 + 8);
      goto LAB_00113704;
    }
    ::std::__cxx11::string::string
              ((string *)local_50,"Already at root directory",(allocator *)&local_28);
    sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_50);
  }
  this_00 = (string *)local_50;
LAB_00113704:
  ::std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

void FtpSession::handleFtpCommandCDUP(const std::string& /*param*/)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0) 
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    if (ftp_working_directory_ != "/")
    {
      // Only CDUP when we are not already at the root directory
      auto cwd_reply = executeCWD("..");
      if (cwd_reply.replyCode() == FtpReplyCode::FILE_ACTION_COMPLETED)
      {
        // The CWD returns FILE_ACTION_COMPLETED on success, while CDUP returns COMMAND_OK on success.
        sendFtpMessage(FtpReplyCode::COMMAND_OK, cwd_reply.message());
        return;
      }
      else
      {
        sendFtpMessage(cwd_reply);
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Already at root directory");
      return;
    }
  }